

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

string * __thiscall
Test::Formats::internal::utf8_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,uint8_t *ptr,size_t length)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (NATIVE_UTF8) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,this,ptr + (long)this);
    std::operator+(&local_50,"\'",&local_30);
    std::operator+(__return_storage_ptr__,&local_50,"\'");
    std::__cxx11::string::~string(&local_50);
    std::__cxx11::string::~string(&local_30);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"(unknown encoding)",(allocator<char> *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf8_to_string(const uint8_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    return "'" + std::string(reinterpret_cast<const char *>(ptr), length) + "'";
  }
#ifdef _MSC_VER
  std::wstring tmp(length * 2U, L'\0');
  auto numChars =
      MultiByteToWideChar(CP_UTF8, 0, reinterpret_cast<const char *>(ptr), length, &tmp.front(), tmp.size());
  tmp.resize(numChars);
  std::string result(length * 2U, '\0');
  numChars = WideCharToMultiByte(CP_ACP, 0, tmp.data(), tmp.size(), &result.front(), result.size(), nullptr, nullptr);
  result.resize(numChars);
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}